

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall GdlGlyphDefn::ExplicitPseudos(GdlGlyphDefn *this,PseudoSet *setpglf,bool param_3)

{
  value_type *ppGVar1;
  reference ppGVar2;
  vector<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_> *in_RSI;
  value_type in_RDI;
  size_t i;
  value_type *__x;
  value_type *local_20;
  
  if (*(int *)&(in_RDI->super_GdlGlyphClassMember).field_0x34 == 5) {
    local_20 = (value_type *)0x0;
    while (__x = local_20,
          ppGVar1 = (value_type *)
                    std::vector<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_>::size(in_RSI),
          __x < ppGVar1) {
      ppGVar2 = std::vector<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_>::operator[]
                          (in_RSI,(size_type_conflict)local_20);
      if (*ppGVar2 == in_RDI) {
        return;
      }
      local_20 = (value_type *)((long)local_20 + 1);
    }
    std::vector<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_>::push_back
              ((vector<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_> *)in_RDI,__x);
  }
  return;
}

Assistant:

void GdlGlyphDefn::ExplicitPseudos(PseudoSet & setpglf, bool /*fProcessClasses*/)
{
	if (m_glft == kglftPseudo)
	{
		Assert(m_pglfOutput);

		// Old std::set implementation:
		//GdlGlyphDefn * p = this;	// kludge until Set can handle const args.
		//setpglf.insert(p);  

		for (size_t i = 0; i < setpglf.size(); i++) {
			if (setpglf[i] == this)
				return;  // already there
		}
		setpglf.push_back(this);
	}
}